

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNodePtr __thiscall punky::par::Parser::parse_call_expression(Parser *this,ExprNodePtr *function)

{
  optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
  *in_RDX;
  undefined1 local_78 [24];
  undefined1 local_60 [8];
  OptCallArgs arguments;
  Token call_tok;
  ExprNodePtr *function_local;
  Parser *this_local;
  
  punky::tok::Token::Token
            ((Token *)&arguments.
                       super__Optional_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
                       ._M_engaged,(Token *)(function + 6));
  parse_call_arguments((Parser *)local_60);
  std::
  make_unique<punky::ast::CallExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>,std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>>>>>
            ((Token *)local_78,
             (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
             &arguments.
              super__Optional_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
              ._M_engaged,in_RDX);
  std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>::
  unique_ptr<punky::ast::CallExpression,std::default_delete<punky::ast::CallExpression>,void>
            ((unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>> *)this,
             (unique_ptr<punky::ast::CallExpression,_std::default_delete<punky::ast::CallExpression>_>
              *)local_78);
  std::unique_ptr<punky::ast::CallExpression,_std::default_delete<punky::ast::CallExpression>_>::
  ~unique_ptr((unique_ptr<punky::ast::CallExpression,_std::default_delete<punky::ast::CallExpression>_>
               *)local_78);
  std::
  optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
  ::~optional((optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
               *)local_60);
  punky::tok::Token::~Token
            ((Token *)&arguments.
                       super__Optional_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
                       ._M_engaged);
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_call_expression(ast::ExprNodePtr function) -> ast::ExprNodePtr
{
    auto call_tok  = m_curr_tok;
    auto arguments = parse_call_arguments();
    return std::make_unique<ast::CallExpression>(call_tok,
                                                 std::move(function), std::move(arguments));
}